

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5MultiIterNew2(Fts5Index *p,Fts5Data *pData,int bDesc,Fts5Iter **ppOut)

{
  byte bVar1;
  Fts5Iter *pFVar2;
  Fts5Iter *pIter_00;
  Fts5SegIter *pIter;
  Fts5Iter *pNew;
  Fts5Iter **ppOut_local;
  Fts5Data *pFStack_18;
  int bDesc_local;
  Fts5Data *pData_local;
  Fts5Index *p_local;
  
  pFVar2 = fts5MultiIterAlloc(p,2);
  pFStack_18 = pData;
  if (pFVar2 != (Fts5Iter *)0x0) {
    pIter_00 = pFVar2 + 1;
    *(undefined4 *)&pFVar2[1].base.pData = 1;
    if (pData->szLeaf < 1) {
      (pFVar2->base).bEof = '\x01';
    }
    else {
      *(Fts5Data **)&pFVar2[1].base.nData = pData;
      bVar1 = sqlite3Fts5GetVarint(pData->p,(u64 *)&pFVar2[1].aSeg[0].flags);
      *(uint *)&pFVar2[1].poslist.p = (uint)bVar1;
      *(int *)((long)&pFVar2[1].xSetOutputs + 4) = pData->nn;
      pFVar2->aFirst[1].iFirst = 1;
      if (bDesc == 0) {
        fts5SegIterLoadNPos(p,(Fts5SegIter *)pIter_00);
      }
      else {
        pFVar2->bRev = 1;
        *(uint *)&pFVar2[1].base.pData = *(uint *)&pFVar2[1].base.pData | 2;
        fts5SegIterReverseInitPage(p,(Fts5SegIter *)pIter_00);
      }
      pFStack_18 = (Fts5Data *)0x0;
    }
    fts5SegIterSetNext(p,(Fts5SegIter *)pIter_00);
    *ppOut = pFVar2;
  }
  fts5DataRelease(pFStack_18);
  return;
}

Assistant:

static void fts5MultiIterNew2(
  Fts5Index *p,                   /* FTS5 backend to iterate within */
  Fts5Data *pData,                /* Doclist to iterate through */
  int bDesc,                      /* True for descending rowid order */
  Fts5Iter **ppOut                /* New object */
){
  Fts5Iter *pNew;
  pNew = fts5MultiIterAlloc(p, 2);
  if( pNew ){
    Fts5SegIter *pIter = &pNew->aSeg[1];

    pIter->flags = FTS5_SEGITER_ONETERM;
    if( pData->szLeaf>0 ){
      pIter->pLeaf = pData;
      pIter->iLeafOffset = fts5GetVarint(pData->p, (u64*)&pIter->iRowid);
      pIter->iEndofDoclist = pData->nn;
      pNew->aFirst[1].iFirst = 1;
      if( bDesc ){
        pNew->bRev = 1;
        pIter->flags |= FTS5_SEGITER_REVERSE;
        fts5SegIterReverseInitPage(p, pIter);
      }else{
        fts5SegIterLoadNPos(p, pIter);
      }
      pData = 0;
    }else{
      pNew->base.bEof = 1;
    }
    fts5SegIterSetNext(p, pIter);

    *ppOut = pNew;
  }

  fts5DataRelease(pData);
}